

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# group_impl.h
# Opt level: O1

void secp256k1_gej_verify(secp256k1_gej *a)

{
  uint64_t *key;
  size_t len;
  uchar *data;
  secp256k1_fe *a_00;
  secp256k1_hmac_sha256 sStack_110;
  secp256k1_gej *psStack_40;
  
  secp256k1_fe_verify(&a->x);
  secp256k1_fe_verify(&a->y);
  a_00 = &a->z;
  secp256k1_fe_verify(a_00);
  secp256k1_fe_verify_magnitude(&a->x,4);
  secp256k1_fe_verify_magnitude(&a->y,4);
  data = (uchar *)0x1;
  secp256k1_fe_verify_magnitude(a_00,1);
  if ((uint)a->infinity < 2) {
    return;
  }
  secp256k1_gej_verify_cold_1();
  a_00->n[2] = 0x101010101010101;
  a_00->n[3] = 0x101010101010101;
  a_00->n[0] = 0x101010101010101;
  a_00->n[1] = 0x101010101010101;
  key = a_00->n + 4;
  a_00->n[4] = 0;
  a_00->magnitude = 0;
  a_00->normalized = 0;
  a_00[1].n[0] = 0;
  *(undefined8 *)((long)(a_00 + 1) + 8) = 0;
  psStack_40 = a;
  secp256k1_hmac_sha256_initialize(&sStack_110,(uchar *)key,0x20);
  secp256k1_sha256_write(&sStack_110.inner,(uchar *)a_00,0x20);
  secp256k1_sha256_write(&sStack_110.inner,"",1);
  secp256k1_sha256_write(&sStack_110.inner,data,len);
  secp256k1_hmac_sha256_finalize(&sStack_110,(uchar *)key);
  secp256k1_hmac_sha256_initialize(&sStack_110,(uchar *)key,0x20);
  secp256k1_sha256_write(&sStack_110.inner,(uchar *)a_00,0x20);
  secp256k1_hmac_sha256_finalize(&sStack_110,(uchar *)a_00);
  secp256k1_hmac_sha256_initialize(&sStack_110,(uchar *)key,0x20);
  secp256k1_sha256_write(&sStack_110.inner,(uchar *)a_00,0x20);
  secp256k1_sha256_write(&sStack_110.inner,"\x01",1);
  secp256k1_sha256_write(&sStack_110.inner,data,len);
  secp256k1_hmac_sha256_finalize(&sStack_110,(uchar *)key);
  secp256k1_hmac_sha256_initialize(&sStack_110,(uchar *)key,0x20);
  secp256k1_sha256_write(&sStack_110.inner,(uchar *)a_00,0x20);
  secp256k1_hmac_sha256_finalize(&sStack_110,(uchar *)a_00);
  *(undefined4 *)((long)(a_00 + 1) + 0x10) = 0;
  return;
}

Assistant:

static void secp256k1_gej_verify(const secp256k1_gej *a) {
    SECP256K1_FE_VERIFY(&a->x);
    SECP256K1_FE_VERIFY(&a->y);
    SECP256K1_FE_VERIFY(&a->z);
    SECP256K1_FE_VERIFY_MAGNITUDE(&a->x, SECP256K1_GEJ_X_MAGNITUDE_MAX);
    SECP256K1_FE_VERIFY_MAGNITUDE(&a->y, SECP256K1_GEJ_Y_MAGNITUDE_MAX);
    SECP256K1_FE_VERIFY_MAGNITUDE(&a->z, SECP256K1_GEJ_Z_MAGNITUDE_MAX);
    VERIFY_CHECK(a->infinity == 0 || a->infinity == 1);
    (void)a;
}